

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O1

void __thiscall
ArcflowSol::ArcflowSol
          (ArcflowSol *this,Instance *_inst,
          map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *_flow,int _S,
          vector<int,_std::allocator<int>_> *_Ts,int _LOSS)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  pointer *pppVar3;
  pointer piVar4;
  pointer pvVar5;
  pointer ppVar6;
  pointer piVar7;
  bool bVar8;
  pattern_pair *pat;
  pointer ppVar9;
  _Rb_tree_node_base *p_Var10;
  runtime_error *prVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *__range1;
  vector<int,_std::allocator<int>_> dem;
  char _error_msg_ [256];
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_180;
  vector<int,_std::allocator<int>_> *local_168;
  vector<int,_std::allocator<int>_> *local_160;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *local_158;
  vector<int,_std::allocator<int>_> local_150;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  local_138 [11];
  
  Instance::Instance(&this->inst,_inst);
  local_158 = &this->flow;
  std::
  _Rb_tree<Arc,_std::pair<const_Arc,_int>,_std::_Select1st<std::pair<const_Arc,_int>_>,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>
  ::_Rb_tree(&local_158->_M_t,&_flow->_M_t);
  this->S = _S;
  std::vector<int,_std::allocator<int>_>::vector(&this->Ts,_Ts);
  this->LOSS = _LOSS;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sols).
  super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = &this->nbins;
  local_160 = &this->Ts;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_150,(long)(this->inst).m,(allocator_type *)local_138);
  if (0 < (this->inst).m) {
    piVar4 = (this->inst).demands.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar12] = piVar4[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->inst).m);
  }
  this->objvalue = 0;
  std::
  vector<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::resize(&this->sols,(long)(this->inst).nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(&this->nbins,(long)(this->inst).nbtypes);
  if (0 < (this->inst).nbtypes) {
    lVar12 = 0;
    do {
      extract_solution(&local_180,this,&local_150,
                       (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar12]);
      pvVar5 = (this->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           pvVar5[lVar12].
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      pppVar3 = (pointer *)
                ((long)&pvVar5[lVar12].
                        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *pppVar3;
      local_138[0].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pppVar3[1];
      pvVar5[lVar12].
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_180.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&pvVar5[lVar12].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 8) =
           local_180.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&pvVar5[lVar12].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data + 0x10) =
           local_180.
           super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_180.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_180.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_180.
      super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector(local_138);
      std::
      vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
      ::~vector(&local_180);
      bVar8 = is_valid(this,(this->sols).
                            super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar12,(int)lVar12);
      if (!bVar8) {
        snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d",
                 "Invalid solution! (capacity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                 ,0x1d);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,(char *)local_138);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar5 = (this->sols).
               super__Vector_base<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_std::allocator<std::vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar9 = pvVar5[lVar12].
               super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = *(pointer *)
                ((long)&pvVar5[lVar12].
                        super__Vector_base<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      if (ppVar9 != ppVar6) {
        piVar4 = (this->inst).Cs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (this->nbins).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar14 = ppVar9->first;
          this->objvalue = this->objvalue + piVar4[lVar12] * iVar14;
          piVar2 = piVar7 + lVar12;
          *piVar2 = *piVar2 + iVar14;
          ppVar9 = ppVar9 + 1;
        } while (ppVar9 != ppVar6);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->inst).nbtypes);
  }
  lVar12 = (long)(this->inst).m;
  if (0 < lVar12) {
    lVar13 = 0;
    do {
      if (0 < local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13]) {
        snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d",
                 "Invalid solution! (demand)",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                 ,0x28);
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar11,(char *)local_138);
        __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
  }
  p_Var10 = (this->flow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->flow)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var10 != p_Var1) {
    iVar14 = 0;
    do {
      iVar14 = iVar14 + *(int *)((long)&p_Var10[1]._M_parent + 4);
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
    if (iVar14 != 0) {
      snprintf((char *)local_138,0x100,"Error: `%s` in \"%s\" line %d","Invalid solution! (flow)",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
               ,0x31);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,(char *)local_138);
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ArcflowSol::ArcflowSol(const Instance &_inst, const std::map<Arc, int> &_flow,
					   int _S, const std::vector<int> &_Ts, int _LOSS) :
		inst(_inst), flow(_flow), S(_S), Ts(_Ts), LOSS(_LOSS) {
	std::vector<int> dem(inst.m);
	for (int i = 0; i < inst.m; i++) {
		dem[i] = inst.demands[i];
	}

	objvalue = 0;
	sols.resize(inst.nbtypes);
	nbins.resize(inst.nbtypes);
	for (int t = 0; t < inst.nbtypes; t++) {
		sols[t] = extract_solution(&dem, Ts[t]);
		if (!is_valid(sols[t], t)) {
			throw_error("Invalid solution! (capacity)");
		}

		for (const pattern_pair &pat : sols[t]) {
			objvalue += pat.first * inst.Cs[t];
			nbins[t] += pat.first;
		}
	}

	for (int i = 0; i < inst.m; i++) {
		if (dem[i] > 0) {
			throw_error("Invalid solution! (demand)");
		}
	}

	int fs = 0;
	for (const auto &kvpair : flow) {
		fs += kvpair.second;
	}
	if (fs != 0) {
		throw_error("Invalid solution! (flow)");
	}
}